

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O1

int oonf_viewer_call_subcommands
              (autobuf *out,abuf_template_storage *storage,char *param,
              oonf_viewer_template *templates,size_t count)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  _Bool _Var5;
  _Bool _Var6;
  
  pcVar3 = (char *)str_hasnextword(param,"head");
  if (pcVar3 == (char *)0x0) {
    pcVar4 = (char *)str_hasnextword(param,"json");
    if (pcVar4 != (char *)0x0) {
      _Var1 = true;
      goto LAB_00101501;
    }
    pcVar4 = (char *)str_hasnextword(param,"raw");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)str_hasnextword(param,"jsonraw");
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)str_hasnextword(param,"data");
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)str_hasnextword(param,"dataraw");
          _Var6 = pcVar4 != (char *)0x0;
          _Var1 = _Var6;
          _Var5 = _Var6;
          if (_Var6) {
            param = pcVar4;
          }
        }
        else {
          _Var6 = false;
          param = pcVar4;
          _Var1 = true;
          _Var5 = true;
        }
      }
      else {
        _Var6 = true;
        param = pcVar4;
        _Var1 = true;
        _Var5 = false;
      }
      goto LAB_00101506;
    }
    _Var6 = true;
    _Var1 = false;
  }
  else {
    _Var1 = false;
    pcVar4 = pcVar3;
LAB_00101501:
    _Var6 = false;
  }
  param = pcVar4;
  _Var5 = false;
LAB_00101506:
  if (count != 0) {
    do {
      pcVar4 = (char *)str_hasnextword(param,templates->json_name);
      if (pcVar4 != (char *)0x0) {
        templates->create_json = _Var1;
        templates->create_raw = _Var6;
        templates->create_only_data = _Var5;
        oonf_viewer_output_prepare(templates,storage,out,pcVar4);
        if (pcVar3 == (char *)0x0) {
          iVar2 = (*templates->cb_function)(templates);
        }
        else {
          abuf_add_template(out,templates->_storage,1);
          abuf_puts(out,"\n");
          iVar2 = 0;
        }
        oonf_viewer_output_finish(templates);
        return iVar2;
      }
      templates = templates + 1;
      count = count - 1;
    } while (count != 0);
  }
  return 1;
}

Assistant:

int
oonf_viewer_call_subcommands(struct autobuf *out, struct abuf_template_storage *storage, const char *param,
  struct oonf_viewer_template *templates, size_t count) {
  const char *next = NULL, *ptr = NULL;
  int result = 0;
  size_t i;
  bool head = false;
  bool json = false;
  bool raw = false;
  bool data = false;

  if ((next = str_hasnextword(param, OONF_VIEWER_HEAD_FORMAT))) {
    head = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_FORMAT))) {
    json = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_RAW_FORMAT))) {
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_JSON_RAW_FORMAT))) {
    json = true;
    raw = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_FORMAT))) {
    json = true;
    data = true;
  }
  else if ((next = str_hasnextword(param, OONF_VIEWER_DATA_RAW_FORMAT))) {
    json = true;
    raw = true;
    data = true;
  }
  else {
    next = param;
  }

  for (i = 0; i < count; i++) {
    if ((ptr = str_hasnextword(next, templates[i].json_name))) {
      templates[i].create_json = json;
      templates[i].create_raw = raw;
      templates[i].create_only_data = data;

      oonf_viewer_output_prepare(&templates[i], storage, out, ptr);

      if (head) {
        abuf_add_template(out, templates[i]._storage, true);
        abuf_puts(out, "\n");
      }
      else {
        result = templates[i].cb_function(&templates[i]);
      }

      oonf_viewer_output_finish(&templates[i]);

      return result;
    }
  }
  return 1;
}